

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int *piVar2;
  Layer *pLVar3;
  undefined4 *puVar4;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  int iVar19;
  byte bVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  byte bVar34;
  undefined7 uVar36;
  Option *pOVar35;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  Option *_elemsize;
  void *pvVar40;
  uint _w;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar81 [16];
  float fVar87;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  uint local_250;
  ulong local_228;
  undefined1 local_208 [40];
  undefined1 auStack_1e0 [16];
  ulong uStack_1d0;
  size_t local_1c8;
  Mat local_1b8;
  undefined1 local_168 [40];
  undefined1 local_140 [16];
  int local_130;
  size_t local_128;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Allocator *local_108;
  int local_100;
  Allocator *local_f8;
  undefined1 local_f0 [16];
  int local_e0;
  ulong local_d8;
  pointer local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  pointer local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined1 local_a0 [16];
  int local_90;
  ulong local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar21 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar21;
  }
  uVar23 = bottom_blob->c;
  uVar38 = bottom_blob->elemsize;
  iVar21 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar39 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar28 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar25 = (this->super_ConvolutionDepthWise).dilation_h;
  iVar22 = bottom_blob->elempack;
  local_1b8.cstep = 0;
  local_1b8.data = (pointer)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_1b8,opt);
  iVar19 = local_1b8.w;
  iVar27 = -100;
  if (((pointer)local_1b8.data == (pointer)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
  goto LAB_0041f0f8;
  iVar21 = (~((iVar21 + -1) * iVar39) + local_1b8.w) / (this->super_ConvolutionDepthWise).stride_w;
  _w = iVar21 + 1;
  iVar39 = (~((iVar28 + -1) * iVar25) + local_1b8.h) / (this->super_ConvolutionDepthWise).stride_h;
  uVar37 = 1;
  if (opt->use_packing_layout == true) {
    uVar31 = (this->super_ConvolutionDepthWise).num_output;
    uVar37 = 8;
    if ((uVar31 & 7) != 0) {
      uVar37 = (ulong)((uVar31 & 3) == 0) * 3 + 1;
    }
  }
  uVar31 = (uint)uVar37;
  _elemsize = (Option *)((uVar38 / (ulong)(long)iVar22) * uVar37);
  pOVar35 = _elemsize;
  Mat::create(top_blob,_w,iVar39 + 1,(this->super_ConvolutionDepthWise).num_output / (int)uVar31,
              (size_t)_elemsize,uVar31,opt->blob_allocator);
  iVar27 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0041f0f8;
  iVar28 = (this->super_ConvolutionDepthWise).num_output;
  iVar25 = (this->super_ConvolutionDepthWise).group;
  if (iVar25 != iVar28 || iVar22 * uVar23 != iVar25) {
LAB_0041df16:
    uVar23 = (int)(iVar22 * uVar23) / iVar25;
    uVar24 = iVar28 / iVar25;
    iVar21 = 1;
    local_250 = 1;
    if (opt->use_packing_layout == true) {
      iVar21 = (uint)((uVar23 & 3) == 0) * 3 + 1;
      if ((uVar23 & 7) == 0) {
        iVar21 = 8;
      }
      local_250 = (uint)((uVar24 & 3) == 0) * 3 + 1;
      if ((uVar24 & 7) == 0) {
        local_250 = 8;
      }
    }
    piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    local_168._0_8_ = local_1b8.data;
    local_168._8_4_ = local_1b8.refcount._0_4_;
    local_168._12_4_ = local_1b8.refcount._4_4_;
    local_168._16_8_ = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
    local_168._24_4_ = local_1b8.elempack;
    local_168._32_8_ = local_1b8.allocator;
    local_140._4_4_ = local_1b8.w;
    local_140._0_4_ = local_1b8.dims;
    local_140._12_4_ = local_1b8.d;
    local_140._8_4_ = local_1b8.h;
    local_130 = local_1b8.c;
    local_128 = local_1b8.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    if (iVar21 < iVar22) {
      local_208._0_8_ = *(undefined8 *)opt;
      local_208._16_8_ = opt->workspace_allocator;
      uVar11 = opt->openmp_blocktime;
      uVar12 = opt->use_winograd_convolution;
      uVar14 = opt->use_sgemm_convolution;
      uVar16 = opt->use_int8_inference;
      uVar18 = opt->use_vulkan_compute;
      uVar17 = CONCAT11(uVar18,uVar16);
      uVar15 = CONCAT21(uVar17,uVar14);
      uVar13 = CONCAT31(uVar15,uVar12);
      local_208._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
      auStack_1e0._0_4_ = opt->vulkan_device_index;
      auStack_1e0[4] = opt->use_reserved_1;
      auStack_1e0[5] = opt->use_image_storage;
      auStack_1e0[6] = opt->use_tensor_storage;
      auStack_1e0[7] = opt->use_reserved_2;
      auStack_1e0._8_4_ = opt->flush_denormals;
      auStack_1e0[0xc] = opt->use_local_pool_allocator;
      auStack_1e0[0xd] = opt->use_shader_local_memory;
      auStack_1e0[0xe] = opt->use_cooperative_matrix;
      auStack_1e0[0xf] = opt->use_winograd23_convolution;
      uStack_1d0._0_1_ = opt->use_winograd43_convolution;
      uStack_1d0._1_1_ = opt->use_winograd63_convolution;
      uStack_1d0._2_1_ = opt->use_a53_a55_optimized_kernel;
      uStack_1d0._3_1_ = opt->use_fp16_uniform;
      uStack_1d0._4_1_ = opt->use_int8_uniform;
      uStack_1d0._5_1_ = opt->use_reserved_9;
      uStack_1d0._6_1_ = opt->use_reserved_10;
      uStack_1d0._7_1_ = opt->use_reserved_11;
      local_208._8_4_ = SUB84(opt->workspace_allocator,0);
      local_208._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_208._24_4_ = uVar11;
      local_208._28_4_ = uVar13;
      convert_packing(&local_1b8,(Mat *)local_168,iVar21,(Option *)local_208);
      if (((pointer)local_168._0_8_ != (pointer)0x0) && ((long)local_130 * local_128 != 0))
      goto LAB_0041e077;
      iVar27 = -100;
    }
    else {
LAB_0041e077:
      piVar2 = top_blob->refcount;
      local_208._0_8_ = top_blob->data;
      local_208._8_4_ = SUB84(top_blob->refcount,0);
      local_208._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_208._16_8_ = top_blob->elemsize;
      local_208._24_4_ = top_blob->elempack;
      local_208._32_8_ = top_blob->allocator;
      auStack_1e0._0_4_ = top_blob->dims;
      auStack_1e0._4_4_ = top_blob->w;
      auStack_1e0._8_4_ = top_blob->h;
      auStack_1e0._12_4_ = top_blob->d;
      uStack_1d0 = CONCAT44(uStack_1d0._4_4_,top_blob->c);
      local_1c8 = top_blob->cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      if (local_250 < uVar31) {
        Mat::create((Mat *)local_208,_w,iVar39 + 1,
                    (this->super_ConvolutionDepthWise).num_output / (int)local_250,
                    (ulong)local_250 * ((ulong)_elemsize / uVar37),local_250,
                    opt->workspace_allocator);
        iVar27 = -100;
        if (((void *)local_208._0_8_ != (void *)0x0) && ((long)(int)uStack_1d0 * local_1c8 != 0))
        goto LAB_0041e14b;
      }
      else {
LAB_0041e14b:
        iVar39 = (this->super_ConvolutionDepthWise).group;
        bVar41 = 0 < iVar39;
        if (iVar39 < 1) {
          iVar27 = -100;
        }
        else {
          iVar27 = -100;
          iVar39 = 0;
          iVar28 = 0;
          lVar33 = 0;
          do {
            local_c8 = (pointer)((long)(iVar39 / iVar21) * local_128 * local_168._16_8_ +
                                local_168._0_8_);
            uStack_c0 = 0;
            uStack_bc = 0;
            local_b8 = (pointer)local_168._16_8_;
            local_b0 = local_168._24_4_;
            local_a8 = (Allocator *)local_168._32_8_;
            local_88 = ((long)(int)local_140._12_4_ * local_168._16_8_ *
                        (long)(int)local_140._8_4_ * (long)(int)local_140._4_4_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_168._16_8_;
            local_a0 = local_140;
            local_118 = (void *)((long)(iVar28 / (int)local_250) * local_1c8 * local_208._16_8_ +
                                local_208._0_8_);
            uStack_110 = 0;
            uStack_10c = 0;
            local_108 = (Allocator *)local_208._16_8_;
            local_100 = local_208._24_4_;
            local_f8 = (Allocator *)local_208._32_8_;
            local_d8 = ((long)(int)auStack_1e0._12_4_ * local_208._16_8_ *
                        (long)(int)auStack_1e0._8_4_ * (long)(int)auStack_1e0._4_4_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_208._16_8_;
            local_f0 = auStack_1e0;
            pLVar3 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar33];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = (Allocator *)local_208._32_8_;
            local_e0 = (int)uVar24 / (int)local_250;
            local_90 = (int)uVar23 / iVar21;
            iVar25 = (*pLVar3->_vptr_Layer[7])(pLVar3,&local_c8,&local_118,&local_78);
            if (iVar25 != 0) {
              iVar27 = iVar25;
            }
            piVar2 = (int *)CONCAT44(uStack_10c,uStack_110);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (local_f8 == (Allocator *)0x0) {
                  if (local_118 != (void *)0x0) {
                    free(local_118);
                  }
                }
                else {
                  (*local_f8->_vptr_Allocator[3])();
                }
              }
            }
            local_d8 = 0;
            local_118 = (void *)0x0;
            uStack_110 = 0;
            uStack_10c = 0;
            local_108 = (Allocator *)0x0;
            local_100 = 0;
            local_f0 = (undefined1  [16])0x0;
            local_e0 = 0;
            piVar2 = (int *)CONCAT44(uStack_bc,uStack_c0);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (local_a8 == (Allocator *)0x0) {
                  if (local_c8 != (pointer)0x0) {
                    free(local_c8);
                  }
                }
                else {
                  (*local_a8->_vptr_Allocator[3])();
                }
              }
            }
            local_88 = 0;
            local_c8 = (pointer)0x0;
            uStack_c0 = 0;
            uStack_bc = 0;
            local_b8 = (pointer)0x0;
            local_b0 = 0;
            local_a0 = (undefined1  [16])0x0;
            local_90 = 0;
            if (iVar25 != 0) break;
            lVar33 = lVar33 + 1;
            lVar26 = (long)(this->super_ConvolutionDepthWise).group;
            iVar28 = iVar28 + uVar24;
            iVar39 = iVar39 + uVar23;
            bVar41 = lVar33 < lVar26;
          } while (lVar33 < lVar26);
        }
        if (!bVar41) {
          if (local_250 < uVar31) {
            convert_packing((Mat *)local_208,top_blob,uVar31,opt);
            iVar27 = -100;
            if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
            goto LAB_0041f01a;
          }
          else if ((Mat *)local_208 != top_blob) {
            piVar2 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            auVar64 = auStack_1e0;
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = (void *)local_208._0_8_;
            top_blob->refcount = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            top_blob->elemsize = local_208._16_8_;
            top_blob->elempack = local_208._24_4_;
            top_blob->allocator = (Allocator *)local_208._32_8_;
            top_blob->dims = auStack_1e0._0_4_;
            top_blob->w = auStack_1e0._4_4_;
            top_blob->h = auStack_1e0._8_4_;
            top_blob->d = auStack_1e0._12_4_;
            top_blob->c = (int)uStack_1d0;
            top_blob->cstep = local_1c8;
            auStack_1e0 = auVar64;
          }
          iVar27 = 0;
        }
      }
LAB_0041f01a:
      piVar2 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
            if ((void *)local_208._0_8_ != (void *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_208._32_8_)[3])();
          }
        }
      }
      local_1c8 = 0;
      local_208._0_8_ = (void *)0x0;
      local_208._8_4_ = 0;
      local_208._12_4_ = 0;
      local_208._16_8_ = (Allocator *)0x0;
      local_208._24_4_ = 0;
      auStack_1e0 = (undefined1  [16])0x0;
      uStack_1d0 = uStack_1d0 & 0xffffffff00000000;
    }
    piVar2 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if ((Allocator *)local_168._32_8_ == (Allocator *)0x0) {
          if ((pointer)local_168._0_8_ != (pointer)0x0) {
            free((void *)local_168._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_168._32_8_)[3])();
        }
      }
    }
    local_128 = 0;
    local_168._0_8_ = (pointer)0x0;
    local_168._8_4_ = 0;
    local_168._12_4_ = 0;
    local_168._16_8_ = (pointer)0x0;
    local_168._24_4_ = 0;
    local_140 = (undefined1  [16])0x0;
    local_130 = 0;
    goto LAB_0041f0f8;
  }
  if (iVar22 == 1) {
    auVar64._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar64._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar64._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar64._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar64 = vpcmpeqd_avx(auVar64,_DAT_005f1840);
    uVar29 = vmovmskps_avx(auVar64);
    iVar21 = (this->super_ConvolutionDepthWise).stride_w;
    uVar24 = (this->super_ConvolutionDepthWise).stride_h;
    if (uVar24 == 1 && (iVar21 == 1 && (uVar29 ^ 0xf) == 0)) {
      convdw3x3s1_sse(&local_1b8,top_blob,&this->weight_data_tm,
                      &(this->super_ConvolutionDepthWise).bias_data,(Option *)(ulong)uVar24);
    }
    else {
      bVar41 = (char)(uVar29 ^ 0xf) == '\0';
      if ((uVar24 != 2 || iVar21 != 2) || !bVar41) goto LAB_0041df16;
      convdw3x3s2_sse(&local_1b8,top_blob,&this->weight_data_tm,
                      &(this->super_ConvolutionDepthWise).bias_data,
                      (Option *)
                      (ulong)CONCAT31((int3)(uVar24 >> 8),(uVar24 == 2 && iVar21 == 2) && bVar41));
    }
LAB_0041e6e4:
    pLVar3 = this->activation;
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[9])(pLVar3,top_blob,opt);
    }
  }
  else {
    uVar36 = (undefined7)((ulong)pOVar35 >> 8);
    if (iVar22 != 4) {
      if (iVar22 != 8) goto LAB_0041df16;
      auVar72._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
      auVar72._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
      auVar72._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
      auVar72._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
      auVar64 = vpcmpeqd_avx(auVar72,_DAT_005f1840);
      iVar22 = vmovmskps_avx(auVar64);
      iVar28 = (this->super_ConvolutionDepthWise).stride_w;
      iVar25 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar25 == 1 && (iVar28 == 1 && iVar22 == 0xf)) {
        convdw3x3s1_pack8_avx
                  (&local_1b8,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,pOVar35);
      }
      else {
        bVar20 = (byte)iVar22;
        if ((iVar25 == 2 && iVar28 == 2) && bVar20 == 0xf) {
          convdw3x3s2_pack8_avx
                    (&local_1b8,top_blob,&this->weight_data_tm,
                     &(this->super_ConvolutionDepthWise).bias_data,
                     (Option *)CONCAT71(uVar36,(iVar25 == 2 && iVar28 == 2) && bVar20 == 0xf));
        }
        else {
          bVar20 = bVar20 >> 2 & bVar20 >> 3 & (auVar72._4_4_ == 5 && auVar72._0_4_ == 5);
          bVar34 = (iVar28 == 1 && iVar25 == 1) & bVar20;
          pOVar35 = (Option *)CONCAT71(uVar36,bVar34);
          if (bVar34 == 1) {
            convdw5x5s1_pack8_avx
                      (&local_1b8,top_blob,&this->weight_data_tm,
                       &(this->super_ConvolutionDepthWise).bias_data,pOVar35);
          }
          else {
            if ((bVar20 & (iVar28 == 2 && iVar25 == 2)) != 1) {
              uVar31 = auVar72._4_4_ * auVar72._0_4_;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_168,(long)(int)uVar31,
                         (allocator_type *)local_208);
              if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
                iVar28 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar25 = (this->super_ConvolutionDepthWise).dilation_w;
                iVar22 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar27 = 0;
                iVar30 = 0;
                iVar32 = 0;
                do {
                  if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                    lVar33 = 0;
                    do {
                      *(int *)(local_168._0_8_ + (iVar27 + lVar33) * 4) = iVar30;
                      iVar30 = iVar30 + (this->super_ConvolutionDepthWise).dilation_w;
                      lVar33 = lVar33 + 1;
                    } while ((int)lVar33 < (this->super_ConvolutionDepthWise).kernel_w);
                    iVar27 = iVar27 + (int)lVar33;
                  }
                  iVar30 = iVar30 + (iVar19 * iVar28 - iVar25 * iVar22);
                  iVar32 = iVar32 + 1;
                } while (iVar32 < (this->super_ConvolutionDepthWise).kernel_h);
              }
              if (0 < (int)uVar23) {
                iVar28 = 0;
                local_228 = 0;
                do {
                  if (-1 < iVar39) {
                    pvVar40 = (void *)(top_blob->cstep * local_228 * top_blob->elemsize +
                                      (long)top_blob->data);
                    pvVar5 = (this->weight_data_tm).data;
                    iVar25 = 0;
                    do {
                      if (-1 < iVar21) {
                        uVar38 = 0;
                        do {
                          if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                            auVar51 = ZEXT1664((undefined1  [16])0x0);
                          }
                          else {
                            auVar51 = ZEXT3264(*(undefined1 (*) [32])
                                                ((long)(this->super_ConvolutionDepthWise).bias_data.
                                                       data + local_228 * 0x20));
                          }
                          auVar50 = auVar51._0_32_;
                          if (0 < (int)uVar31) {
                            lVar33 = 0;
                            do {
                              auVar64 = vfmadd231ps_fma(auVar51._0_32_,
                                                        *(undefined1 (*) [32])
                                                         ((long)local_1b8.data +
                                                         (long)*(int *)(local_168._0_8_ + lVar33) *
                                                         0x20 + (long)((this->
                                                  super_ConvolutionDepthWise).stride_w * (int)uVar38
                                                  * 8) * 4 +
                                                  (long)(this->super_ConvolutionDepthWise).stride_h
                                                  * (long)iVar25 *
                                                  (long)local_1b8.w *
                                                  CONCAT44(local_1b8.elemsize._4_4_,
                                                           (undefined4)local_1b8.elemsize) +
                                                  local_1b8.cstep * local_228 *
                                                  CONCAT44(local_1b8.elemsize._4_4_,
                                                           (undefined4)local_1b8.elemsize)),
                                                  *(undefined1 (*) [32])
                                                   ((long)pvVar5 + lVar33 * 8 + (long)iVar28 * 4));
                              auVar51 = ZEXT1664(auVar64);
                              auVar50 = ZEXT1632(auVar64);
                              lVar33 = lVar33 + 4;
                            } while ((ulong)uVar31 << 2 != lVar33);
                          }
                          *(undefined1 (*) [32])((long)pvVar40 + uVar38 * 0x20) = auVar50;
                          uVar38 = uVar38 + 1;
                        } while (uVar38 != _w);
                      }
                      pvVar40 = (void *)((long)pvVar40 + (long)(int)(_w * 8) * 4);
                      bVar41 = iVar25 != iVar39;
                      iVar25 = iVar25 + 1;
                    } while (bVar41);
                  }
                  local_228 = local_228 + 1;
                  iVar28 = iVar28 + uVar31 * 8;
                } while (local_228 != uVar23);
              }
              pLVar3 = this->activation;
              if (pLVar3 != (Layer *)0x0) {
                (*pLVar3->_vptr_Layer[9])(pLVar3,top_blob,opt);
              }
              goto LAB_0041ef69;
            }
            convdw5x5s2_pack8_avx
                      (&local_1b8,top_blob,&this->weight_data_tm,
                       &(this->super_ConvolutionDepthWise).bias_data,pOVar35);
          }
        }
      }
      goto LAB_0041e6e4;
    }
    auVar53._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar53._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar53._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar53._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar64 = vpcmpeqd_avx(auVar53,_DAT_005f1840);
    iVar22 = vmovmskps_avx(auVar64);
    iVar28 = (this->super_ConvolutionDepthWise).stride_w;
    iVar25 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar25 == 1 && (iVar28 == 1 && iVar22 == 0xf)) {
      convdw3x3s1_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar35);
      goto LAB_0041e6e4;
    }
    bVar20 = (byte)iVar22;
    if ((iVar25 == 2 && iVar28 == 2) && bVar20 == 0xf) {
      convdw3x3s2_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,
                 (Option *)CONCAT71(uVar36,(iVar25 == 2 && iVar28 == 2) && bVar20 == 0xf));
      goto LAB_0041e6e4;
    }
    bVar20 = bVar20 >> 2 & bVar20 >> 3 & (auVar53._4_4_ == 5 && auVar53._0_4_ == 5);
    bVar34 = (iVar28 == 1 && iVar25 == 1) & bVar20;
    pOVar35 = (Option *)CONCAT71(uVar36,bVar34);
    if (bVar34 == 1) {
      convdw5x5s1_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar35);
      goto LAB_0041e6e4;
    }
    if ((bVar20 & (iVar28 == 2 && iVar25 == 2)) == 1) {
      convdw5x5s2_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar35);
      goto LAB_0041e6e4;
    }
    uVar31 = auVar53._4_4_ * auVar53._0_4_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_168,(long)(int)uVar31,
               (allocator_type *)local_208);
    if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
      iVar28 = (this->super_ConvolutionDepthWise).dilation_h;
      iVar25 = (this->super_ConvolutionDepthWise).dilation_w;
      iVar22 = (this->super_ConvolutionDepthWise).kernel_w;
      iVar27 = 0;
      iVar30 = 0;
      iVar32 = 0;
      do {
        if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
          lVar33 = 0;
          do {
            *(int *)(local_168._0_8_ + (iVar32 + lVar33) * 4) = iVar30;
            iVar30 = iVar30 + (this->super_ConvolutionDepthWise).dilation_w;
            lVar33 = lVar33 + 1;
          } while ((int)lVar33 < (this->super_ConvolutionDepthWise).kernel_w);
          iVar32 = iVar32 + (int)lVar33;
        }
        iVar30 = iVar30 + (iVar19 * iVar28 - iVar25 * iVar22);
        iVar27 = iVar27 + 1;
      } while (iVar27 < (this->super_ConvolutionDepthWise).kernel_h);
    }
    if (0 < (int)uVar23) {
      iVar28 = 0;
      auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar51 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar76 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      local_228 = 0;
      auVar80._8_4_ = 0x3c088908;
      auVar80._0_8_ = 0x3c0889083c088908;
      auVar80._12_4_ = 0x3c088908;
      do {
        if (-1 < iVar39) {
          pvVar40 = (void *)(top_blob->cstep * local_228 * top_blob->elemsize + (long)top_blob->data
                            );
          pvVar5 = (this->weight_data_tm).data;
          iVar25 = 0;
          do {
            if (-1 < iVar21) {
              uVar38 = 0;
              do {
                if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                  auVar81 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar81 = *(undefined1 (*) [16])
                             ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                             local_228 * 0x10);
                }
                if (0 < (int)uVar31) {
                  lVar33 = 0;
                  do {
                    auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])
                                                       ((long)pvVar5 + lVar33 * 4 + (long)iVar28 * 4
                                                       ),
                                              *(undefined1 (*) [16])
                                               ((long)local_1b8.data +
                                               (long)*(int *)(local_168._0_8_ + lVar33) * 0x10 +
                                               (long)((this->super_ConvolutionDepthWise).stride_w *
                                                      (int)uVar38 * 4) * 4 +
                                               (long)(this->super_ConvolutionDepthWise).stride_h *
                                               (long)iVar25 *
                                               (long)local_1b8.w *
                                               CONCAT44(local_1b8.elemsize._4_4_,
                                                        (undefined4)local_1b8.elemsize) +
                                               local_1b8.cstep * local_228 *
                                               CONCAT44(local_1b8.elemsize._4_4_,
                                                        (undefined4)local_1b8.elemsize)));
                    lVar33 = lVar33 + 4;
                  } while ((ulong)uVar31 << 2 != lVar33);
                }
                auVar53 = auVar100._0_16_;
                auVar72 = auVar76._0_16_;
                auVar64 = auVar51._0_16_;
                fVar7 = auVar76._4_4_;
                fVar8 = auVar76._8_4_;
                fVar9 = auVar76._12_4_;
                fVar85 = auVar81._4_4_;
                fVar6 = auVar76._0_4_;
                fVar86 = auVar81._8_4_;
                fVar87 = auVar81._12_4_;
                switch((this->super_ConvolutionDepthWise).activation_type) {
                case 1:
                  auVar81 = vmaxps_avx(auVar81,auVar53);
                  break;
                case 2:
                  auVar64 = vmaxps_avx(auVar81,auVar53);
                  auVar72 = vminps_avx(auVar81,auVar53);
                  uVar1 = *(this->super_ConvolutionDepthWise).activation_params.data;
                  auVar84._4_4_ = uVar1;
                  auVar84._0_4_ = uVar1;
                  auVar84._8_4_ = uVar1;
                  auVar84._12_4_ = uVar1;
                  auVar81 = vfmadd213ps_fma(auVar84,auVar72,auVar64);
                  break;
                case 3:
                  puVar4 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar4;
                  auVar55._4_4_ = uVar1;
                  auVar55._0_4_ = uVar1;
                  auVar55._8_4_ = uVar1;
                  auVar55._12_4_ = uVar1;
                  uVar1 = puVar4[1];
                  auVar110._4_4_ = uVar1;
                  auVar110._0_4_ = uVar1;
                  auVar110._8_4_ = uVar1;
                  auVar110._12_4_ = uVar1;
                  auVar64 = vmaxps_avx(auVar81,auVar55);
                  auVar81 = vminps_avx(auVar110,auVar64);
                  break;
                case 4:
                  auVar56._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
                  auVar56._8_4_ = -fVar86;
                  auVar56._12_4_ = -fVar87;
                  auVar65._8_4_ = 0x42b0c0a5;
                  auVar65._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar65._12_4_ = 0x42b0c0a5;
                  auVar53 = vminps_avx(auVar56,auVar65);
                  auVar66._8_4_ = 0xc2b0c0a5;
                  auVar66._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar66._12_4_ = 0xc2b0c0a5;
                  auVar97 = vmaxps_avx(auVar53,auVar66);
                  auVar82._8_4_ = 0x3fb8aa3b;
                  auVar82._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar82._12_4_ = 0x3fb8aa3b;
                  auVar53 = vfmadd213ps_fma(auVar82,auVar97,auVar64);
                  auVar111._0_4_ = (int)auVar53._0_4_;
                  auVar111._4_4_ = (int)auVar53._4_4_;
                  auVar111._8_4_ = (int)auVar53._8_4_;
                  auVar111._12_4_ = (int)auVar53._12_4_;
                  auVar81 = vcvtdq2ps_avx(auVar111);
                  auVar53 = vcmpps_avx(auVar53,auVar81,1);
                  auVar53 = vandps_avx(auVar53,auVar72);
                  auVar53 = vsubps_avx(auVar81,auVar53);
                  auVar47._8_4_ = 0x3f318000;
                  auVar47._0_8_ = 0x3f3180003f318000;
                  auVar47._12_4_ = 0x3f318000;
                  auVar81 = vfmsub231ps_fma(auVar97,auVar53,auVar47);
                  auVar67._8_4_ = 0x395e8083;
                  auVar67._0_8_ = 0x395e8083395e8083;
                  auVar67._12_4_ = 0x395e8083;
                  auVar97 = vfmsub231ps_fma(auVar81,auVar53,auVar67);
                  auVar112._0_4_ = auVar97._0_4_ * auVar97._0_4_;
                  auVar112._4_4_ = auVar97._4_4_ * auVar97._4_4_;
                  auVar112._8_4_ = auVar97._8_4_ * auVar97._8_4_;
                  auVar112._12_4_ = auVar97._12_4_ * auVar97._12_4_;
                  auVar99._8_4_ = 0x39506967;
                  auVar99._0_8_ = 0x3950696739506967;
                  auVar99._12_4_ = 0x39506967;
                  auVar68._8_4_ = 0x3ab743ce;
                  auVar68._0_8_ = 0x3ab743ce3ab743ce;
                  auVar68._12_4_ = 0x3ab743ce;
                  auVar81 = vfmadd213ps_fma(auVar99,auVar97,auVar68);
                  auVar69._8_4_ = 0x3c088908;
                  auVar69._0_8_ = 0x3c0889083c088908;
                  auVar69._12_4_ = 0x3c088908;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar97,auVar69);
                  auVar48._8_4_ = 0x3d2aa9c1;
                  auVar48._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar48._12_4_ = 0x3d2aa9c1;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar97,auVar48);
                  auVar49._8_4_ = 0x3e2aaaaa;
                  auVar49._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar49._12_4_ = 0x3e2aaaaa;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar97,auVar49);
                  auVar64 = vfmadd213ps_fma(auVar81,auVar97,auVar64);
                  auVar64 = vfmadd213ps_fma(auVar64,auVar112,auVar97);
                  auVar57._0_4_ = auVar64._0_4_ + fVar6;
                  auVar57._4_4_ = auVar64._4_4_ + fVar7;
                  auVar57._8_4_ = auVar64._8_4_ + fVar8;
                  auVar57._12_4_ = auVar64._12_4_ + fVar9;
                  auVar100 = ZEXT864(0) << 0x20;
                  auVar83._0_4_ = (int)auVar53._0_4_;
                  auVar83._4_4_ = (int)auVar53._4_4_;
                  auVar83._8_4_ = (int)auVar53._8_4_;
                  auVar83._12_4_ = (int)auVar53._12_4_;
                  auVar64 = vpslld_avx(auVar83,0x17);
                  auVar64 = vpaddd_avx(auVar64,auVar72);
                  auVar64 = vfmadd213ps_fma(auVar64,auVar57,auVar72);
                  auVar81 = vdivps_avx(auVar72,auVar64);
                  break;
                case 5:
                  auVar101._8_4_ = 0x42b0c0a5;
                  auVar101._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar101._12_4_ = 0x42b0c0a5;
                  auVar53 = vminps_avx(auVar81,auVar101);
                  auVar103._8_4_ = 0xc2b0c0a5;
                  auVar103._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar103._12_4_ = 0xc2b0c0a5;
                  auVar70 = vmaxps_avx(auVar103,auVar53);
                  auVar105._8_4_ = 0x3fb8aa3b;
                  auVar105._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar105._12_4_ = 0x3fb8aa3b;
                  auVar53 = vfmadd213ps_fma(auVar105,auVar70,auVar64);
                  auVar107._0_4_ = (int)auVar53._0_4_;
                  auVar107._4_4_ = (int)auVar53._4_4_;
                  auVar107._8_4_ = (int)auVar53._8_4_;
                  auVar107._12_4_ = (int)auVar53._12_4_;
                  auVar97 = vcvtdq2ps_avx(auVar107);
                  auVar53 = vcmpps_avx(auVar53,auVar97,1);
                  auVar53 = vandps_avx(auVar53,auVar72);
                  auVar53 = vsubps_avx(auVar97,auVar53);
                  auVar102._8_4_ = 0x3f318000;
                  auVar102._0_8_ = 0x3f3180003f318000;
                  auVar102._12_4_ = 0x3f318000;
                  auVar97 = vfmsub231ps_fma(auVar70,auVar53,auVar102);
                  auVar104._8_4_ = 0xb95e8083;
                  auVar104._0_8_ = 0xb95e8083b95e8083;
                  auVar104._12_4_ = 0xb95e8083;
                  auVar70 = vfnmsub231ps_fma(auVar97,auVar53,auVar104);
                  auVar108._0_4_ = auVar70._0_4_ * auVar70._0_4_;
                  auVar108._4_4_ = auVar70._4_4_ * auVar70._4_4_;
                  auVar108._8_4_ = auVar70._8_4_ * auVar70._8_4_;
                  auVar108._12_4_ = auVar70._12_4_ * auVar70._12_4_;
                  auVar106._8_4_ = 0x39506967;
                  auVar106._0_8_ = 0x3950696739506967;
                  auVar106._12_4_ = 0x39506967;
                  auVar71._8_4_ = 0x3ab743ce;
                  auVar71._0_8_ = 0x3ab743ce3ab743ce;
                  auVar71._12_4_ = 0x3ab743ce;
                  auVar97 = vfmadd213ps_fma(auVar106,auVar70,auVar71);
                  auVar97 = vfmadd213ps_fma(auVar97,auVar70,auVar80);
                  auVar77._8_4_ = 0x3d2aa9c1;
                  auVar77._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar77._12_4_ = 0x3d2aa9c1;
                  auVar97 = vfmadd213ps_fma(auVar97,auVar70,auVar77);
                  auVar78._8_4_ = 0x3e2aaaaa;
                  auVar78._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar78._12_4_ = 0x3e2aaaaa;
                  auVar97 = vfmadd213ps_fma(auVar97,auVar70,auVar78);
                  auVar97 = vfmadd213ps_fma(auVar97,auVar70,auVar64);
                  auVar97 = vfmadd213ps_fma(auVar97,auVar108,auVar70);
                  auVar58._0_4_ = auVar97._0_4_ + fVar6;
                  auVar58._4_4_ = auVar97._4_4_ + fVar7;
                  auVar58._8_4_ = auVar97._8_4_ + fVar8;
                  auVar58._12_4_ = auVar97._12_4_ + fVar9;
                  auVar52._0_4_ = (int)auVar53._0_4_;
                  auVar52._4_4_ = (int)auVar53._4_4_;
                  auVar52._8_4_ = (int)auVar53._8_4_;
                  auVar52._12_4_ = (int)auVar53._12_4_;
                  auVar53 = vpslld_avx(auVar52,0x17);
                  auVar53 = vpaddd_avx(auVar53,auVar72);
                  auVar46 = vfmadd213ps_fma(auVar53,auVar58,auVar72);
                  auVar42._8_4_ = 0x800000;
                  auVar42._0_8_ = 0x80000000800000;
                  auVar42._12_4_ = 0x800000;
                  auVar53 = vmaxps_avx(auVar46,auVar42);
                  auVar97 = vpsrld_avx(auVar53,0x17);
                  auVar43._8_4_ = 0xffffff82;
                  auVar43._0_8_ = 0xffffff82ffffff82;
                  auVar43._12_4_ = 0xffffff82;
                  auVar97 = vpaddd_avx(auVar97,auVar43);
                  auVar44._8_4_ = 0x807fffff;
                  auVar44._0_8_ = 0x807fffff807fffff;
                  auVar44._12_4_ = 0x807fffff;
                  auVar53 = vandps_avx(auVar53,auVar44);
                  auVar10 = vorps_avx(auVar53,auVar64);
                  auVar70 = vcvtdq2ps_avx(auVar97);
                  auVar45._8_4_ = 0x3f3504f3;
                  auVar45._0_8_ = 0x3f3504f33f3504f3;
                  auVar45._12_4_ = 0x3f3504f3;
                  auVar97 = vcmpps_avx(auVar10,auVar45,1);
                  auVar53 = vandps_avx(auVar97,auVar10);
                  auVar59._0_4_ = auVar10._0_4_ + -1.0 + auVar53._0_4_;
                  auVar59._4_4_ = auVar10._4_4_ + -1.0 + auVar53._4_4_;
                  auVar59._8_4_ = auVar10._8_4_ + -1.0 + auVar53._8_4_;
                  auVar59._12_4_ = auVar10._12_4_ + -1.0 + auVar53._12_4_;
                  auVar53 = vandps_avx(auVar97,auVar72);
                  auVar97 = vsubps_avx(auVar70,auVar53);
                  auVar98._0_4_ = auVar59._0_4_ * auVar59._0_4_;
                  auVar98._4_4_ = auVar59._4_4_ * auVar59._4_4_;
                  auVar98._8_4_ = auVar59._8_4_ * auVar59._8_4_;
                  auVar98._12_4_ = auVar59._12_4_ * auVar59._12_4_;
                  auVar109._8_4_ = 0x3d9021bb;
                  auVar109._0_8_ = 0x3d9021bb3d9021bb;
                  auVar109._12_4_ = 0x3d9021bb;
                  auVar88._8_4_ = 0xbdebd1b8;
                  auVar88._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar88._12_4_ = 0xbdebd1b8;
                  auVar53 = vfmadd213ps_fma(auVar109,auVar59,auVar88);
                  auVar89._8_4_ = 0x3def251a;
                  auVar89._0_8_ = 0x3def251a3def251a;
                  auVar89._12_4_ = 0x3def251a;
                  auVar53 = vfmadd213ps_fma(auVar53,auVar59,auVar89);
                  auVar90._8_4_ = 0xbdfe5d4f;
                  auVar90._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar90._12_4_ = 0xbdfe5d4f;
                  auVar53 = vfmadd213ps_fma(auVar53,auVar59,auVar90);
                  auVar91._8_4_ = 0x3e11e9bf;
                  auVar91._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar91._12_4_ = 0x3e11e9bf;
                  auVar53 = vfmadd213ps_fma(auVar53,auVar59,auVar91);
                  auVar92._8_4_ = 0xbe2aae50;
                  auVar92._0_8_ = 0xbe2aae50be2aae50;
                  auVar92._12_4_ = 0xbe2aae50;
                  auVar53 = vfmadd213ps_fma(auVar53,auVar59,auVar92);
                  auVar93._8_4_ = 0x3e4cceac;
                  auVar93._0_8_ = 0x3e4cceac3e4cceac;
                  auVar93._12_4_ = 0x3e4cceac;
                  auVar53 = vfmadd213ps_fma(auVar53,auVar59,auVar93);
                  auVar94._8_4_ = 0xbe7ffffc;
                  auVar94._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar94._12_4_ = 0xbe7ffffc;
                  auVar53 = vfmadd213ps_fma(auVar53,auVar59,auVar94);
                  auVar95._8_4_ = 0x3eaaaaaa;
                  auVar95._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar95._12_4_ = 0x3eaaaaaa;
                  auVar53 = vfmadd213ps_fma(auVar53,auVar59,auVar95);
                  auVar96._0_4_ = auVar98._0_4_ * auVar59._0_4_ * auVar53._0_4_;
                  auVar96._4_4_ = auVar98._4_4_ * auVar59._4_4_ * auVar53._4_4_;
                  auVar96._8_4_ = auVar98._8_4_ * auVar59._8_4_ * auVar53._8_4_;
                  auVar96._12_4_ = auVar98._12_4_ * auVar59._12_4_ * auVar53._12_4_;
                  auVar53 = vfmadd231ps_fma(auVar96,auVar97,auVar104);
                  auVar70 = vfmsub231ps_fma(auVar53,auVar64,auVar98);
                  auVar10._12_4_ = 0;
                  auVar10._0_12_ = ZEXT412(0);
                  auVar100 = ZEXT1264(ZEXT412(0)) << 0x20;
                  auVar53 = vcmpps_avx(auVar46,auVar10 << 0x20,2);
                  auVar70 = vsubps_avx(auVar70,auVar59);
                  auVar97 = vfnmadd231ps_fma(auVar70,auVar102,auVar97);
                  auVar60._0_4_ = auVar97._0_4_ + auVar97._0_4_;
                  auVar60._4_4_ = auVar97._4_4_ + auVar97._4_4_;
                  auVar60._8_4_ = auVar97._8_4_ + auVar97._8_4_;
                  auVar60._12_4_ = auVar97._12_4_ + auVar97._12_4_;
                  auVar73._8_4_ = 0x7fffffff;
                  auVar73._0_8_ = 0x7fffffff7fffffff;
                  auVar73._12_4_ = 0x7fffffff;
                  auVar53 = vblendvps_avx(auVar60,auVar73,auVar53);
                  auVar61._8_4_ = 0x42b0c0a5;
                  auVar61._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar61._12_4_ = 0x42b0c0a5;
                  auVar53 = vminps_avx(auVar53,auVar61);
                  auVar62._8_4_ = 0xc2b0c0a5;
                  auVar62._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar62._12_4_ = 0xc2b0c0a5;
                  auVar70 = vmaxps_avx(auVar53,auVar62);
                  auVar53 = vfmadd213ps_fma(auVar105,auVar70,auVar64);
                  auVar74._0_4_ = (int)auVar53._0_4_;
                  auVar74._4_4_ = (int)auVar53._4_4_;
                  auVar74._8_4_ = (int)auVar53._8_4_;
                  auVar74._12_4_ = (int)auVar53._12_4_;
                  auVar97 = vcvtdq2ps_avx(auVar74);
                  auVar53 = vcmpps_avx(auVar53,auVar97,1);
                  auVar53 = vandps_avx(auVar53,auVar72);
                  auVar53 = vsubps_avx(auVar97,auVar53);
                  auVar97 = vfmsub231ps_fma(auVar70,auVar53,auVar102);
                  auVar70 = vfnmsub231ps_fma(auVar97,auVar53,auVar104);
                  auVar75._0_4_ = auVar70._0_4_ * auVar70._0_4_;
                  auVar75._4_4_ = auVar70._4_4_ * auVar70._4_4_;
                  auVar75._8_4_ = auVar70._8_4_ * auVar70._8_4_;
                  auVar75._12_4_ = auVar70._12_4_ * auVar70._12_4_;
                  auVar97 = vfmadd213ps_fma(auVar106,auVar70,auVar71);
                  auVar51 = ZEXT1664(auVar64);
                  auVar97 = vfmadd213ps_fma(auVar97,auVar70,auVar80);
                  auVar79._8_4_ = 0x3d2aa9c1;
                  auVar79._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar79._12_4_ = 0x3d2aa9c1;
                  auVar97 = vfmadd213ps_fma(auVar97,auVar70,auVar79);
                  auVar97 = vfmadd213ps_fma(auVar97,auVar70,auVar78);
                  auVar64 = vfmadd213ps_fma(auVar97,auVar70,auVar64);
                  auVar64 = vfmadd213ps_fma(auVar64,auVar75,auVar70);
                  auVar76 = ZEXT1664(auVar72);
                  auVar54._0_4_ = auVar64._0_4_ + fVar6;
                  auVar54._4_4_ = auVar64._4_4_ + fVar7;
                  auVar54._8_4_ = auVar64._8_4_ + fVar8;
                  auVar54._12_4_ = auVar64._12_4_ + fVar9;
                  auVar63._0_4_ = (int)auVar53._0_4_;
                  auVar63._4_4_ = (int)auVar53._4_4_;
                  auVar63._8_4_ = (int)auVar53._8_4_;
                  auVar63._12_4_ = (int)auVar53._12_4_;
                  auVar64 = vpslld_avx(auVar63,0x17);
                  auVar64 = vpaddd_avx(auVar64,auVar72);
                  auVar64 = vfmadd213ps_fma(auVar64,auVar54,auVar72);
                  auVar46._8_4_ = 0x40000000;
                  auVar46._0_8_ = 0x4000000040000000;
                  auVar46._12_4_ = 0x40000000;
                  auVar64 = vdivps_avx(auVar46,auVar64);
                  auVar81 = vfmsub231ps_fma(auVar81,auVar81,auVar64);
                  break;
                case 6:
                  puVar4 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar4;
                  auVar97._4_4_ = uVar1;
                  auVar97._0_4_ = uVar1;
                  auVar97._8_4_ = uVar1;
                  auVar97._12_4_ = uVar1;
                  uVar1 = puVar4[1];
                  auVar70._4_4_ = uVar1;
                  auVar70._0_4_ = uVar1;
                  auVar70._8_4_ = uVar1;
                  auVar70._12_4_ = uVar1;
                  auVar64 = vfmadd231ps_fma(auVar70,auVar81,auVar97);
                  auVar64 = vmaxps_avx(auVar53,auVar64);
                  auVar64 = vminps_avx(auVar64,auVar72);
                  auVar81._0_4_ = auVar81._0_4_ * auVar64._0_4_;
                  auVar81._4_4_ = fVar85 * auVar64._4_4_;
                  auVar81._8_4_ = fVar86 * auVar64._8_4_;
                  auVar81._12_4_ = fVar87 * auVar64._12_4_;
                }
                *(undefined1 (*) [16])((long)pvVar40 + uVar38 * 0x10) = auVar81;
                uVar38 = uVar38 + 1;
              } while (uVar38 != _w);
            }
            pvVar40 = (void *)((long)pvVar40 + (long)(int)(_w * 4) * 4);
            bVar41 = iVar25 != iVar39;
            iVar25 = iVar25 + 1;
          } while (bVar41);
        }
        local_228 = local_228 + 1;
        iVar28 = iVar28 + uVar31 * 4;
      } while (local_228 != uVar23);
    }
LAB_0041ef69:
    if ((pointer)local_168._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ - local_168._0_8_);
    }
  }
  iVar27 = 0;
LAB_0041f0f8:
  piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if ((pointer)local_1b8.data != (pointer)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}